

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticencoder.cpp
# Opt level: O0

void __thiscall ArithmeticEncoder::propagate_carry(ArithmeticEncoder *this)

{
  U8 *local_18;
  U8 *p;
  ArithmeticEncoder *this_local;
  
  if (this->outbyte == this->outbuffer) {
    local_18 = this->endbuffer;
  }
  else {
    local_18 = this->outbyte;
  }
  local_18 = local_18 + -1;
  do {
    if (*local_18 != 0xff) {
      *local_18 = *local_18 + '\x01';
      return;
    }
    *local_18 = '\0';
    if (local_18 == this->outbuffer) {
      local_18 = this->endbuffer;
    }
    local_18 = local_18 + -1;
    if (local_18 < this->outbuffer) {
      __assert_fail("outbuffer <= p",
                    "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                    ,0x14d,"void ArithmeticEncoder::propagate_carry()");
    }
    if (this->endbuffer <= local_18) {
      __assert_fail("p < endbuffer",
                    "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                    ,0x14e,"void ArithmeticEncoder::propagate_carry()");
    }
  } while (this->outbyte < this->endbuffer);
  __assert_fail("outbyte < endbuffer",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                ,0x14f,"void ArithmeticEncoder::propagate_carry()");
}

Assistant:

inline void ArithmeticEncoder::propagate_carry()
{
  U8 * p;
  if (outbyte == outbuffer)
    p = endbuffer - 1;
  else
    p = outbyte - 1;
  while (*p == 0xFFU)
  {
    *p = 0;
    if (p == outbuffer)
      p = endbuffer - 1;
    else
      p--;
    assert(outbuffer <= p);
    assert(p < endbuffer);
    assert(outbyte < endbuffer);
  }
  ++*p;
}